

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

Image * __thiscall
anon_unknown.dwarf_9a3be::ImageManager::operator()(ImageManager *this,Image *image)

{
  byte bVar1;
  value_type *__x;
  ImageTemplate<unsigned_char> *in_RSI;
  __fn *in_RDI;
  void *in_R8;
  ImageManager *this_00;
  ImageTemplate<unsigned_char> *local_18;
  reference local_8;
  
  local_18 = in_RSI;
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RSI);
  if ((uint)bVar1 == (uint)(byte)in_RDI[0x68]) {
    local_8 = local_18;
  }
  else {
    __x = (value_type *)(in_RDI + 0x38);
    this_00 = (ImageManager *)&stack0xffffffffffffffc0;
    _clone(this_00,in_RDI,local_18,(uint)(byte)in_RDI[0x68],in_R8);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::push_back((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 *)this_00,__x);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x161d40);
    local_8 = std::
              vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ::back((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                      *)this_00);
  }
  return local_8;
}

Assistant:

const PenguinV_Image::Image & operator ()( const PenguinV_Image::Image & image )
        {
            if ( image.type() != _type ) {
                _inputClone.push_back( _clone( image ) );
                return _inputClone.back();
            }
            else {
                return image;
            }
        }